

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void combine_interintra(INTERINTRA_MODE mode,int8_t use_wedge_interintra,int8_t wedge_index,
                       int8_t wedge_sign,BLOCK_SIZE bsize,BLOCK_SIZE plane_bsize,uint8_t *comppred,
                       int compstride,uint8_t *interpred,int interstride,uint8_t *intrapred,
                       int intrastride)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  int8_t in_CL;
  int8_t in_DL;
  char in_SIL;
  byte in_DIL;
  BLOCK_SIZE in_R8B;
  byte in_R9B;
  uint8_t *in_stack_00000008;
  uint32_t in_stack_00000010;
  uint8_t *in_stack_00000018;
  uint32_t in_stack_00000020;
  uint8_t *in_stack_00000028;
  uint32_t in_stack_00000030;
  uint8_t *mask;
  int subh;
  int subw;
  uint8_t *mask_1;
  int bh;
  int bw;
  
  uVar1 = (uint)block_size_wide[in_R9B];
  uVar2 = (uint)block_size_high[in_R9B];
  if (in_SIL == '\0') {
    (*aom_blend_a64_mask)
              (in_stack_00000008,in_stack_00000010,in_stack_00000028,in_stack_00000030,
               in_stack_00000018,in_stack_00000020,smooth_interintra_mask_buf[in_DIL][in_R9B],uVar1,
               uVar1,uVar2,0,0);
  }
  else {
    iVar3 = av1_is_wedge_used(in_R8B);
    if (iVar3 != 0) {
      puVar4 = av1_get_contiguous_soft_mask(in_DL,in_CL,in_R8B);
      (*aom_blend_a64_mask)
                (in_stack_00000008,in_stack_00000010,in_stack_00000028,in_stack_00000030,
                 in_stack_00000018,in_stack_00000020,puVar4,(uint32_t)block_size_wide[in_R8B],uVar1,
                 uVar2,SUB14((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                   [in_R8B] << 1 == uVar1,0),
                 SUB14((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [in_R8B] << 1 == uVar2,0));
    }
  }
  return;
}

Assistant:

static inline void combine_interintra(
    INTERINTRA_MODE mode, int8_t use_wedge_interintra, int8_t wedge_index,
    int8_t wedge_sign, BLOCK_SIZE bsize, BLOCK_SIZE plane_bsize,
    uint8_t *comppred, int compstride, const uint8_t *interpred,
    int interstride, const uint8_t *intrapred, int intrastride) {
  const int bw = block_size_wide[plane_bsize];
  const int bh = block_size_high[plane_bsize];

  if (use_wedge_interintra) {
    if (av1_is_wedge_used(bsize)) {
      const uint8_t *mask =
          av1_get_contiguous_soft_mask(wedge_index, wedge_sign, bsize);
      const int subw = 2 * mi_size_wide[bsize] == bw;
      const int subh = 2 * mi_size_high[bsize] == bh;
      aom_blend_a64_mask(comppred, compstride, intrapred, intrastride,
                         interpred, interstride, mask, block_size_wide[bsize],
                         bw, bh, subw, subh);
    }
    return;
  }

  const uint8_t *mask = smooth_interintra_mask_buf[mode][plane_bsize];
  aom_blend_a64_mask(comppred, compstride, intrapred, intrastride, interpred,
                     interstride, mask, bw, bw, bh, 0, 0);
}